

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int binchr(bstring b0,int pos,bstring b1)

{
  int iVar1;
  uchar *puVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  byte *pbVar7;
  bool bVar8;
  charField chrs;
  charField local_60;
  ulong uVar6;
  
  if ((b0 != (bstring)0x0 && -1 < pos) && (puVar2 = b0->data, puVar2 != (uchar *)0x0)) {
    uVar4 = (ulong)(uint)pos;
    iVar1 = b0->slen;
    if ((pos < iVar1) && (iVar3 = buildCharField(&local_60,b1), -1 < iVar3)) {
      pbVar7 = puVar2 + uVar4;
      uVar6 = uVar4;
      do {
        bVar8 = ((uint)local_60.content[*pbVar7 >> 5] >> (*pbVar7 & 0x1f) & 1) != 0;
        if (bVar8) {
          uVar4 = uVar6;
        }
        if (bVar8) {
          return (int)uVar4;
        }
        uVar5 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar5;
        pbVar7 = pbVar7 + 1;
      } while ((int)uVar5 < iVar1);
    }
  }
  return -1;
}

Assistant:

int binchr (const bstring b0, int pos, const bstring b1) {
struct charField chrs;
	if (pos < 0 || b0 == NULL || b0->data == NULL ||
	    b0->slen <= pos) return BSTR_ERR;
	if (buildCharField (&chrs, b1) < 0) return BSTR_ERR;
	return binchrCF (b0->data, b0->slen, pos, &chrs);
}